

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O2

bool google::protobuf::internal::WireFormatLite::ReadMessage
               (CodedInputStream *input,MessageLite *value)

{
  bool bVar1;
  Limit limit;
  int iVar2;
  uint32 length;
  uint32 local_1c;
  
  bVar1 = io::CodedInputStream::ReadVarint32(input,&local_1c);
  if ((bVar1) &&
     (iVar2 = input->recursion_depth_, input->recursion_depth_ = iVar2 + 1,
     iVar2 < input->recursion_limit_)) {
    limit = io::CodedInputStream::PushLimit(input,local_1c);
    iVar2 = (*value->_vptr_MessageLite[8])(value,input);
    if (((char)iVar2 != '\0') && (input->legitimate_message_end_ == true)) {
      io::CodedInputStream::PopLimit(input,limit);
      if (input->recursion_depth_ < 1) {
        return true;
      }
      input->recursion_depth_ = input->recursion_depth_ + -1;
      return true;
    }
  }
  return false;
}

Assistant:

inline bool WireFormatLite::ReadMessage(io::CodedInputStream* input,
                                        MessageLite* value) {
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  if (!input->IncrementRecursionDepth()) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  if (!value->MergePartialFromCodedStream(input)) return false;
  // Make sure that parsing stopped when the limit was hit, not at an endgroup
  // tag.
  if (!input->ConsumedEntireMessage()) return false;
  input->PopLimit(limit);
  input->DecrementRecursionDepth();
  return true;
}